

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

QNode * despot::DESPOT::SelectBestUpperBoundNode(VNode *vnode)

{
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar1;
  QNode *pQVar2;
  ulong uVar3;
  ACT_TYPE action;
  ulong uVar4;
  double dVar5;
  double local_28;
  
  local_28 = -INFINITY;
  uVar3 = 0xffffffffffffffff;
  uVar4 = 0;
  while( true ) {
    pvVar1 = VNode::children(vnode);
    if ((ulong)((long)(pvVar1->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar1->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) break;
    pQVar2 = VNode::Child(vnode,(ACT_TYPE)uVar4);
    dVar5 = QNode::upper_bound(pQVar2);
    if (local_28 < dVar5) {
      local_28 = QNode::upper_bound(pQVar2);
      uVar3 = uVar4 & 0xffffffff;
    }
    uVar4 = uVar4 + 1;
  }
  if (-1 < (int)uVar3) {
    pQVar2 = VNode::Child(vnode,(int)uVar3);
    return pQVar2;
  }
  __assert_fail("astar >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/solver/despot.cpp"
                ,0x20c,"static QNode *despot::DESPOT::SelectBestUpperBoundNode(VNode *)");
}

Assistant:

QNode* DESPOT::SelectBestUpperBoundNode(VNode* vnode) {
	int astar = -1;
	double upperstar = Globals::NEG_INFTY;
	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* qnode = vnode->Child(action);

		if (qnode->upper_bound() > upperstar) {
			upperstar = qnode->upper_bound();
			astar = action;
		}
	}
	assert(astar >= 0);
	return vnode->Child(astar);
}